

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetCompileOptionsCommand.h
# Opt level: O2

cmCommand * __thiscall cmTargetCompileOptionsCommand::Clone(cmTargetCompileOptionsCommand *this)

{
  cmCommand *this_00;
  
  this_00 = (cmCommand *)operator_new(0x78);
  cmTargetCompileOptionsCommand((cmTargetCompileOptionsCommand *)this_00);
  return this_00;
}

Assistant:

virtual cmCommand* Clone()
    {
    return new cmTargetCompileOptionsCommand;
    }